

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

int searcher_Croot(lua_State *L)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  int stat;
  char *p;
  char *name;
  char *filename;
  lua_State *L_local;
  
  __s = luaL_checklstring(L,1,(size_t *)0x0);
  pcVar2 = strchr(__s,0x2e);
  if (pcVar2 == (char *)0x0) {
    L_local._4_4_ = 0;
  }
  else {
    lua_pushlstring(L,__s,(long)pcVar2 - (long)__s);
    pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
    pcVar2 = findfile(L,pcVar2,"cpath","/");
    if (pcVar2 == (char *)0x0) {
      L_local._4_4_ = 1;
    }
    else {
      iVar1 = loadfunc(L,pcVar2,__s);
      if (iVar1 == 0) {
        lua_pushstring(L,pcVar2);
        L_local._4_4_ = 2;
      }
      else if (iVar1 == 2) {
        lua_pushfstring(L,"\n\tno module \'%s\' in file \'%s\'",__s,pcVar2);
        L_local._4_4_ = 1;
      }
      else {
        L_local._4_4_ = checkload(L,0,pcVar2);
      }
    }
  }
  return L_local._4_4_;
}

Assistant:

static int searcher_Croot(lua_State *L) {
    const char *filename;
    const char *name = luaL_checkstring(L, 1);
    const char *p = strchr(name, '.');
    int stat;
    if (p == NULL) return 0;  /* is root */
    lua_pushlstring(L, name, p - name);
    filename = findfile(L, lua_tostring(L, -1), "cpath", LUA_CSUBSEP);
    if (filename == NULL) return 1;  /* root not found */
    if ((stat = loadfunc(L, filename, name)) != 0) {
        if (stat != ERRFUNC)
            return checkload(L, 0, filename);  /* real error */
        else {  /* open function not found */
            lua_pushfstring(L, "\n\tno module '%s' in file '%s'", name, filename);
            return 1;
        }
    }
    lua_pushstring(L, filename);  /* will be 2nd argument to module */
    return 2;
}